

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  stbi__uint16 sVar4;
  undefined1 auVar5 [16];
  long lVar6;
  int iVar7;
  stbi__uint16 *psVar8;
  int iVar9;
  stbi__uint16 *psVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ushort *puVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  
  psVar8 = data;
  if (req_comp != img_n) {
    psVar8 = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
    if (psVar8 == (stbi__uint16 *)0x0) {
      free(data);
      psVar8 = (stbi__uint16 *)0x0;
      *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
    }
    else {
      if (0 < (int)y) {
        auVar17[8] = 0xff;
        auVar17._0_8_ = 0xffffffffffffffff;
        auVar17[9] = 0xff;
        auVar17[10] = 0xff;
        auVar17[0xb] = 0xff;
        auVar17[0xc] = 0xff;
        auVar17[0xd] = 0xff;
        auVar17[0xe] = 0xff;
        auVar17[0xf] = 0xff;
        uVar14 = 0;
        uVar16 = 0;
        uVar12 = 0;
        iVar9 = x - 1;
        iVar7 = req_comp + img_n * 8;
        do {
          if (iVar7 - 10U < 0x1a) {
            iVar11 = (int)uVar12 * x;
            puVar15 = data + (uint)(iVar11 * img_n);
            switch(iVar7) {
            case 10:
              if (-1 < iVar9) {
                lVar13 = 0;
                do {
                  psVar8[uVar14 + lVar13 * 2] = data[uVar16 + lVar13];
                  psVar8[uVar14 + lVar13 * 2 + 1] = 0xffff;
                  lVar13 = lVar13 + 1;
                } while (x != (uint)lVar13);
              }
              break;
            case 0xb:
              if (-1 < iVar9) {
                psVar10 = psVar8 + uVar14 + 2;
                lVar13 = 0;
                do {
                  sVar4 = data[uVar16 + lVar13];
                  lVar13 = lVar13 + 1;
                  *psVar10 = sVar4;
                  psVar10[-1] = sVar4;
                  psVar10[-2] = sVar4;
                  psVar10 = psVar10 + 3;
                } while (x != (uint)lVar13);
              }
              break;
            case 0xc:
              if (-1 < iVar9) {
                lVar13 = 0;
                do {
                  auVar5 = vpinsrw_avx(auVar17,(uint)data[uVar16 + lVar13],0);
                  auVar5 = vpshuflw_avx(auVar5,0x40);
                  *(long *)(psVar8 + uVar14 + lVar13 * 4) = auVar5._0_8_;
                  lVar13 = lVar13 + 1;
                } while (x != (uint)lVar13);
              }
              break;
            case 0x11:
              if (-1 < iVar9) {
                lVar13 = 0;
                do {
                  psVar8[uVar14 + lVar13] = data[uVar16 + lVar13 * 2];
                  lVar13 = lVar13 + 1;
                } while (x != (uint)lVar13);
              }
              break;
            case 0x13:
              if (-1 < iVar9) {
                psVar10 = psVar8 + uVar14 + 2;
                lVar13 = 0;
                do {
                  sVar4 = data[uVar16 + lVar13 * 2];
                  lVar13 = lVar13 + 1;
                  *psVar10 = sVar4;
                  psVar10[-1] = sVar4;
                  psVar10[-2] = sVar4;
                  psVar10 = psVar10 + 3;
                } while (x != (uint)lVar13);
              }
              break;
            case 0x14:
              if (-1 < iVar9) {
                lVar13 = 0;
                do {
                  auVar5 = vpshuflw_avx(ZEXT416(*(uint *)(data + uVar16 + lVar13 * 2)),0x40);
                  *(long *)(psVar8 + uVar14 + lVar13 * 4) = auVar5._0_8_;
                  lVar13 = lVar13 + 1;
                } while (x != (uint)lVar13);
              }
              break;
            case 0x19:
              if (-1 < iVar9) {
                lVar13 = 0;
                do {
                  uVar2 = *puVar15;
                  puVar1 = puVar15 + 1;
                  uVar3 = puVar15[2];
                  puVar15 = puVar15 + 3;
                  psVar8[uVar14 + lVar13] =
                       (stbi__uint16)
                       ((uint)uVar3 * 2 + ((uint)uVar3 + (uint)uVar3 * 8) * 3 +
                        (uint)*puVar1 * 0x96 + (uint)uVar2 * 0x4d >> 8);
                  lVar13 = lVar13 + 1;
                } while (x != (uint)lVar13);
              }
              break;
            case 0x1a:
              if (-1 < iVar9) {
                lVar13 = 0;
                do {
                  uVar2 = puVar15[2];
                  uVar3 = *puVar15;
                  puVar1 = puVar15 + 1;
                  puVar15 = puVar15 + 3;
                  psVar8[uVar14 + lVar13 * 2] =
                       (stbi__uint16)
                       ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                        (uint)*puVar1 * 0x96 + (uint)uVar3 * 0x4d >> 8);
                  psVar8[uVar14 + lVar13 * 2 + 1] = 0xffff;
                  lVar13 = lVar13 + 1;
                } while (x != (uint)lVar13);
              }
              break;
            case 0x1c:
              if (-1 < iVar9) {
                lVar13 = 0;
                do {
                  *(undefined4 *)(psVar8 + uVar14 + lVar13 * 4) = *(undefined4 *)puVar15;
                  puVar1 = puVar15 + 2;
                  puVar15 = puVar15 + 3;
                  psVar8[uVar14 + lVar13 * 4 + 2] = *puVar1;
                  psVar8[uVar14 + lVar13 * 4 + 3] = 0xffff;
                  lVar13 = lVar13 + 1;
                } while (x != (uint)lVar13);
              }
              break;
            case 0x21:
              if (-1 < iVar9) {
                lVar13 = 0;
                do {
                  uVar2 = data[uVar16 + lVar13 * 4 + 2];
                  psVar8[uVar14 + lVar13] =
                       (stbi__uint16)
                       ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                        (uint)data[uVar16 + lVar13 * 4 + 1] * 0x96 +
                        (uint)data[uVar16 + lVar13 * 4] * 0x4d >> 8);
                  lVar13 = lVar13 + 1;
                } while (x != (uint)lVar13);
              }
              break;
            case 0x22:
              if (-1 < iVar9) {
                lVar13 = 0;
                do {
                  uVar2 = data[uVar16 + lVar13 * 4 + 2];
                  psVar8[uVar14 + lVar13 * 2] =
                       (stbi__uint16)
                       ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                        (uint)data[uVar16 + lVar13 * 4 + 1] * 0x96 +
                        (uint)data[uVar16 + lVar13 * 4] * 0x4d >> 8);
                  psVar8[uVar14 + lVar13 * 2 + 1] = data[uVar16 + lVar13 * 4 + 3];
                  lVar13 = lVar13 + 1;
                } while (x != (uint)lVar13);
              }
              break;
            case 0x23:
              if (-1 < iVar9) {
                lVar13 = 0;
                psVar10 = psVar8 + (uint)(iVar11 * req_comp);
                do {
                  *(undefined4 *)psVar10 = *(undefined4 *)(data + uVar16 + lVar13 * 4);
                  lVar6 = lVar13 * 4;
                  lVar13 = lVar13 + 1;
                  psVar10[2] = data[uVar16 + lVar6 + 2];
                  psVar10 = psVar10 + 3;
                } while (x != (uint)lVar13);
              }
            }
          }
          uVar16 = (ulong)((int)uVar16 + x * img_n);
          uVar12 = uVar12 + 1;
          uVar14 = (ulong)((int)uVar14 + req_comp * x);
        } while (uVar12 != y);
      }
      free(data);
    }
  }
  return psVar8;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}